

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfLut.cpp
# Opt level: O1

void __thiscall Imf_3_4::RgbaLut::apply(RgbaLut *this,Rgba *data,int nData,int stride)

{
  RgbaChannels RVar1;
  half *phVar2;
  half *phVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  
  if (nData != 0) {
    phVar2 = (this->_lut)._lut;
    RVar1 = this->_chn;
    auVar5._0_4_ = -(uint)((RVar1 & WRITE_A) == 0);
    auVar5._4_4_ = -(uint)((RVar1 & WRITE_B) == 0);
    auVar5._8_4_ = -(uint)((RVar1 & WRITE_G) == 0);
    auVar5._12_4_ = -(uint)((RVar1 & WRITE_R) == 0);
    uVar4 = movmskps((int)this,auVar5);
    phVar3 = &data->a;
    do {
      if ((byte)((byte)uVar4 >> 3) == 0) {
        (((Rgba *)(phVar3 + -3))->r)._h = phVar2[(((Rgba *)(phVar3 + -3))->r)._h]._h;
      }
      if ((uVar4 & 4) == 0) {
        phVar3[-2]._h = phVar2[phVar3[-2]._h]._h;
      }
      if ((uVar4 & 2) == 0) {
        phVar3[-1]._h = phVar2[phVar3[-1]._h]._h;
      }
      if ((uVar4 & 1) == 0) {
        phVar3->_h = phVar2[phVar3->_h]._h;
      }
      phVar3 = phVar3 + (long)stride * 4;
      nData = nData + -1;
    } while (nData != 0);
  }
  return;
}

Assistant:

void
RgbaLut::apply (Rgba* data, int nData, int stride) const
{
    while (nData)
    {
        if (_chn & WRITE_R) data->r = _lut (data->r);

        if (_chn & WRITE_G) data->g = _lut (data->g);

        if (_chn & WRITE_B) data->b = _lut (data->b);

        if (_chn & WRITE_A) data->a = _lut (data->a);

        data += stride;
        nData -= 1;
    }
}